

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void expr_primary(LexState *ls,ExpDesc *v)

{
  int iVar1;
  BCLine line;
  FuncState *fs;
  BCReg BVar2;
  BCReg BVar3;
  GCstr *name;
  GCobj *gc;
  BCReg BVar4;
  uint uVar5;
  ExpDesc key;
  ExpDesc local_48;
  
  fs = ls->fs;
  iVar1 = ls->tok;
  if ((iVar1 == 0x11f) || (iVar1 == 0x10a)) {
    name = lex_str(ls);
    var_lookup_(fs,name,v,1);
  }
  else {
    if (iVar1 != 0x28) {
      err_syntax(ls,LJ_ERR_XSYMBOL);
    }
    line = ls->linenumber;
    lj_lex_next(ls);
    expr_binop(ls,v,0);
    lex_match(ls,0x29,0x28,line);
    expr_discharge(ls->fs,v);
  }
LAB_0012dd00:
  while (iVar1 = ls->tok, 0x5a < iVar1) {
    if (iVar1 != 0x5b) {
      if ((iVar1 != 0x7b) && (iVar1 != 0x120)) {
        return;
      }
      goto LAB_0012dd70;
    }
    expr_toanyreg(fs,v);
    expr_bracket(ls,&local_48);
    expr_index(fs,v,&local_48);
  }
  if (iVar1 == 0x28) {
LAB_0012dd70:
    expr_tonextreg(fs,v);
  }
  else {
    if (iVar1 == 0x2e) {
      expr_field(ls,v);
      goto LAB_0012dd00;
    }
    if (iVar1 != 0x3a) {
      return;
    }
    lj_lex_next(ls);
    gc = (GCobj *)lex_str(ls);
    BVar2 = expr_toanyreg(fs,v);
    if (v->k == VNONRELOC) {
      BVar4 = fs->freereg;
      if (fs->nactvar <= (v->u).s.info) {
        BVar4 = BVar4 - 1;
        fs->freereg = BVar4;
      }
    }
    else {
      BVar4 = fs->freereg;
    }
    uVar5 = BVar4 * 0x100;
    bcemit_INS(fs,BVar2 << 0x10 | uVar5 + 0x112);
    BVar3 = const_gc(fs,gc,0xfffffffb);
    if (BVar3 < 0x100) {
      bcreg_reserve(fs,2);
      bcemit_INS(fs,uVar5 | BVar3 << 0x10 | BVar2 << 0x18 | 0x39);
    }
    else {
      bcreg_reserve(fs,3);
      bcemit_INS(fs,BVar3 << 0x10 | (BVar4 + 2) * 0x100 | 0x27);
      bcemit_INS(fs,BVar2 << 0x18 | uVar5 | (BVar4 + 2) * 0x10000 | 0x38);
      fs->freereg = fs->freereg - 1;
    }
    (v->u).s.info = BVar4;
    v->k = VNONRELOC;
  }
  parse_args(ls,v);
  goto LAB_0012dd00;
}

Assistant:

static void expr_primary(LexState *ls, ExpDesc *v)
{
  FuncState *fs = ls->fs;
  /* Parse prefix expression. */
  if (ls->tok == '(') {
    BCLine line = ls->linenumber;
    lj_lex_next(ls);
    expr(ls, v);
    lex_match(ls, ')', '(', line);
    expr_discharge(ls->fs, v);
  } else if (ls->tok == TK_name || (!LJ_52 && ls->tok == TK_goto)) {
    var_lookup(ls, v);
  } else {
    err_syntax(ls, LJ_ERR_XSYMBOL);
  }
  for (;;) {  /* Parse multiple expression suffixes. */
    if (ls->tok == '.') {
      expr_field(ls, v);
    } else if (ls->tok == '[') {
      ExpDesc key;
      expr_toanyreg(fs, v);
      expr_bracket(ls, &key);
      expr_index(fs, v, &key);
    } else if (ls->tok == ':') {
      ExpDesc key;
      lj_lex_next(ls);
      expr_str(ls, &key);
      bcemit_method(fs, v, &key);
      parse_args(ls, v);
    } else if (ls->tok == '(' || ls->tok == TK_string || ls->tok == '{') {
      expr_tonextreg(fs, v);
      if (LJ_FR2) bcreg_reserve(fs, 1);
      parse_args(ls, v);
    } else {
      break;
    }
  }
}